

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O1

void secp256k1_scratch_apply_checkpoint
               (secp256k1_callback *error_callback,secp256k1_scratch *scratch,size_t checkpoint)

{
  long lVar1;
  int iVar2;
  
  lVar1 = 0;
  do {
    iVar2 = (uint)scratch->magic[lVar1] - (uint)(byte)"scratch"[lVar1];
    if (scratch->magic[lVar1] != "scratch"[lVar1]) goto LAB_00160fdd;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  iVar2 = 0;
LAB_00160fdd:
  if (iVar2 != 0) {
    (*error_callback->fn)("invalid scratch space",error_callback->data);
    return;
  }
  if (checkpoint <= scratch->alloc_size) {
    scratch->alloc_size = checkpoint;
    return;
  }
  (*error_callback->fn)("invalid checkpoint",error_callback->data);
  return;
}

Assistant:

static void secp256k1_scratch_apply_checkpoint(const secp256k1_callback* error_callback, secp256k1_scratch* scratch, size_t checkpoint) {
    if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
        secp256k1_callback_call(error_callback, "invalid scratch space");
        return;
    }
    if (checkpoint > scratch->alloc_size) {
        secp256k1_callback_call(error_callback, "invalid checkpoint");
        return;
    }
    scratch->alloc_size = checkpoint;
}